

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtype.cpp
# Opt level: O3

void __thiscall vm_val_t::cast_to_num(vm_val_t *this,vm_val_t *retval)

{
  vm_obj_id_t vVar1;
  
  switch(this->typ) {
  case VM_NIL:
    retval->typ = VM_INT;
    (retval->val).obj = 0;
    return;
  case VM_TRUE:
    retval->typ = VM_INT;
    (retval->val).obj = 1;
    return;
  default:
    err_throw(0x7fa);
  case VM_OBJ:
    (**(code **)(*(long *)&G_obj_table_X.pages_[(this->val).obj >> 0xc][(this->val).obj & 0xfff].
                           ptr_ + 0x158))();
    return;
  case VM_INT:
    vVar1 = (this->val).obj;
    retval->typ = VM_INT;
    (retval->val).obj = vVar1;
    return;
  case VM_SSTRING:
    CVmObjString::parse_num_val
              (retval,(char *)((long)(G_const_pool_X.super_CVmPoolPaged.pages_
                                      [(this->val).obj >>
                                       ((byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_ &
                                       0x1f)].mem +
                                     (G_const_pool_X.super_CVmPoolPaged._8_4_ - 1 & (this->val).obj)
                                     ) + 2),
               (ulong)*(ushort *)
                       (G_const_pool_X.super_CVmPoolPaged.pages_
                        [(this->val).obj >>
                         ((byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem +
                       (G_const_pool_X.super_CVmPoolPaged._8_4_ - 1 & (this->val).obj)),10,0);
    return;
  }
}

Assistant:

void vm_val_t::cast_to_num(VMG_ vm_val_t *retval) const
{
    /* check the type */
    switch (typ)
    {
    case VM_TRUE:
        retval->set_int(1);
        break;

    case VM_NIL:
        retval->set_int(0);
        break;
        
    case VM_INT:
        /* it's already numeric */
        retval->set_int(val.intval);
        break;

    case VM_SSTRING:
        {
            /* get the string constant */
            const char *p = G_const_pool->get_ptr(val.ofs);

            /* parse it as an integer */
            CVmObjString::parse_num_val(
                vmg_ retval, p + VMB_LEN, vmb_get_len(p), 10, FALSE);
        }
        break;

    case VM_OBJ:
        /* ask the object to do the conversion */
        vm_objp(vmg_ val.obj)->cast_to_num(vmg_ retval, val.obj);
        break;

    default:
        /* there's no numeric conversion */
        err_throw(VMERR_NO_NUM_CONV);
    }
}